

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImg<char> * __thiscall
cimg_library::CImg<char>::set_vector_at<char>(CImg<char> *this,CImg<char> *vec,uint x,uint y,uint z)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  
  uVar1 = this->_width;
  if (((x < uVar1) && (y < this->_height)) && (uVar2 = this->_depth, z < uVar2)) {
    uVar9 = vec->_height * vec->_width * vec->_depth * vec->_spectrum;
    uVar3 = this->_spectrum;
    uVar6 = uVar3;
    if (uVar9 < uVar3) {
      uVar6 = uVar9;
    }
    if (uVar6 != 0) {
      lVar8 = (ulong)this->_height * (ulong)uVar1;
      pcVar5 = this->_data + (ulong)z * lVar8 + (ulong)y * (ulong)uVar1 + (ulong)x;
      pcVar4 = vec->_data;
      if (uVar3 < uVar9) {
        uVar9 = uVar3;
      }
      lVar7 = 0;
      do {
        *pcVar5 = pcVar4[lVar7];
        pcVar5 = pcVar5 + (ulong)uVar2 * lVar8;
        lVar7 = lVar7 + 1;
      } while (uVar9 != (uint)lVar7);
    }
  }
  return this;
}

Assistant:

CImg<T>& set_vector_at(const CImg<t>& vec, const unsigned int x, const unsigned int y=0, const unsigned int z=0) {
      if (x<_width && y<_height && z<_depth) {
        const t *ptrs = vec._data;
        const unsigned long whd = (unsigned long)_width*_height*_depth;
        T *ptrd = data(x,y,z);
        for (unsigned int k = cimg::min((unsigned int)vec.size(),_spectrum); k; --k) {
          *ptrd = (T)*(ptrs++); ptrd+=whd;
        }
      }
      return *this;
    }